

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.cpp
# Opt level: O3

ComplexPair * __thiscall
Iir::BandStopTransform::transform
          (ComplexPair *__return_storage_ptr__,BandStopTransform *this,complex_t c)

{
  undefined8 uVar1;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined4 local_58;
  undefined1 local_48 [16];
  double local_38;
  double dStack_30;
  
  if (INFINITY <= (double)CONCAT44(in_XMM0_Db,in_XMM0_Da)) {
    local_38 = -1.0;
    if ((in_XMM1_Qa == 0.0) && (dStack_30 = 0.0, !NAN(in_XMM1_Qa))) goto LAB_00106804;
  }
  local_38 = (double)__divdc3(SUB84((double)CONCAT44(in_XMM0_Db,in_XMM0_Da) + 1.0,0),
                              __return_storage_ptr__,this,c._M_value._0_8_,c._M_value._8_8_);
  dStack_30 = in_XMM1_Qa;
LAB_00106804:
  dVar8 = (this->b2 + this->a2 + -1.0) * 4.0;
  local_48._8_8_ = dVar8 * dStack_30 + 0.0;
  local_48._0_8_ = ((this->b2 - this->a2) + 1.0) * 8.0 + local_38 * dVar8 + 0.0;
  std::complex<double>::operator*=((complex<double> *)local_48,(complex<double> *)&local_38);
  local_48._0_8_ = (this->a2 + this->b2 + -1.0) * 4.0 + (double)local_48._0_8_;
  dVar3 = csqrt((double)local_48._0_8_);
  dVar8 = this->a;
  dVar5 = dVar8 * local_38;
  dVar9 = (double)local_48._8_8_ * -0.5 - dVar8 * dStack_30;
  dVar4 = (dVar3 * 0.5 + dVar8) - dVar8 * local_38;
  dVar6 = (double)local_48._8_8_ * 0.5 - dVar8 * dStack_30;
  local_48._8_4_ = SUB84(dVar6,0);
  local_48._0_8_ = dVar4;
  local_48._12_4_ = (int)((ulong)dVar6 >> 0x20);
  dVar7 = this->b + -1.0;
  dVar10 = local_38 * dVar7 + this->b + 1.0;
  dVar7 = dVar7 * dStack_30;
  uVar1 = __divdc3(SUB84(dVar4,0),dVar6,dVar10);
  local_58 = SUB84((dVar8 - dVar3 * 0.5) - dVar5,0);
  uVar2 = __divdc3(local_58,dVar9,dVar10,dVar7 + 0.0);
  *(undefined8 *)(__return_storage_ptr__->super_complex_pair_t).first._M_value = uVar1;
  *(double *)((__return_storage_ptr__->super_complex_pair_t).first._M_value + 8) = dVar6;
  *(undefined8 *)(__return_storage_ptr__->super_complex_pair_t).second._M_value = uVar2;
  *(double *)((__return_storage_ptr__->super_complex_pair_t).second._M_value + 8) = dVar9;
  return __return_storage_ptr__;
}

Assistant:

ComplexPair BandStopTransform::transform (complex_t c)
{
	if (c == infinity())
		c = -1;
	else
		c = (1. + c) / (1. - c); // bilinear
	
	complex_t u (0);
	u = addmul (u, 4 * (b2 + a2 - 1), c);
	u += 8 * (b2 - a2 + 1);
	u *= c;
	u += 4 * (a2 + b2 - 1);
	u = std::sqrt (u);
	
	complex_t v = u * -.5;
	v += a;
	v = addmul (v, -a, c);
	
	u *= .5;
	u += a;
	u = addmul (u, -a, c);
	
	complex_t d (b + 1);
	d = addmul (d, b-1, c);
	
	return ComplexPair (u/d, v/d);
}